

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector3 * vector3_divide(vector3 *self,vector3 *vT)

{
  float fVar1;
  
  fVar1 = (self->field_0).v[1];
  (self->field_0).v[0] = (self->field_0).v[0] / (vT->field_0).v[0];
  (self->field_0).v[1] = fVar1 / (vT->field_0).v[1];
  (self->field_0).v[2] = (self->field_0).v[2] / (vT->field_0).v[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_divide(struct vector3 *self, const struct vector3 *vT)
{
	self->v[0] /= vT->v[0];
	self->v[1] /= vT->v[1];
	self->v[2] /= vT->v[2];
	return self;
}